

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanorod_pentBuilderCmd.cpp
# Opt level: O1

int cmdline_parser_internal
              (int argc,char **argv,gengetopt_args_info *args_info,cmdline_parser_params *params,
              char *additional_error)

{
  custom_getopt_data *pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  cmdline_parser_arg_type arg_type;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  char *default_value;
  void *pvVar11;
  size_t sVar12;
  long lVar13;
  char **ppcVar14;
  uint *prev_given;
  uint *field_given;
  custom_getopt_data *pcVar15;
  char *pcVar16;
  generic_list **list;
  double *field;
  cmdline_parser_arg_type arg_type_00;
  undefined8 in_R9;
  char *pcVar17;
  size_t sVar18;
  gengetopt_args_info *args_info_00;
  custom_getopt_data *pcVar19;
  option *poVar20;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  char cVar24;
  char *pcVar25;
  bool bVar26;
  undefined8 in_stack_fffffffffffffd30;
  generic_list *in_stack_fffffffffffffd38;
  char in_stack_fffffffffffffd40;
  option *in_stack_fffffffffffffd48;
  option *poVar27;
  option *poVar28;
  int local_29c;
  generic_list *molFraction_list;
  generic_list *shellRadius_list;
  int local_264;
  gengetopt_args_info *local_260;
  ulong local_258;
  long local_250;
  custom_getopt_data *local_248;
  double *local_240;
  uint *local_238;
  uint *local_230;
  custom_getopt_data *local_228;
  double *local_220;
  uint *local_218;
  uint *local_210;
  custom_getopt_data *local_208;
  double *local_200;
  uint *local_1f8;
  uint *local_1f0;
  custom_getopt_data *local_1e8;
  double *local_1e0;
  uint *local_1d8;
  uint *local_1d0;
  custom_getopt_data *local_1c8;
  double *local_1c0;
  uint *local_1b8;
  uint *local_1b0;
  custom_getopt_data *local_1a8;
  double *local_1a0;
  uint *local_198;
  uint *local_190;
  custom_getopt_data *local_188;
  char **local_180;
  uint *local_178;
  uint *local_170;
  gengetopt_args_info local_168;
  
  uVar23 = (ulong)(uint)argc;
  shellRadius_list = (generic_list *)0x0;
  molFraction_list = (generic_list *)0x0;
  package_name = *argv;
  arg_type = params->override;
  local_264 = params->check_required;
  default_value = (char *)(ulong)(uint)params->check_ambiguity;
  pcVar16 = (char *)argv;
  if (params->initialize != 0) {
    in_stack_fffffffffffffd30 = 0x12e65a;
    cmdline_parser_init(args_info);
  }
  local_168.vacancyPercent_given = 0;
  local_168.vacancyInnerRadius_given = 0;
  local_168.vacancyOuterRadius_given = 0;
  local_168.radius_given = 0;
  local_168.length_given = 0;
  local_168.shellRadius_given = 0;
  local_168.molFraction_given = 0;
  local_168.help_given = 0;
  local_168.version_given = 0;
  local_168.output_given = 0;
  local_168.latticeConstant_given = 0;
  local_168.latticeConstant_orig = (char *)0x0;
  local_168.radius_orig = (char *)0x0;
  local_168.length_orig = (char *)0x0;
  local_168.vacancyPercent_orig = (char *)0x0;
  local_168.vacancyInnerRadius_orig = (char *)0x0;
  local_168.vacancyOuterRadius_orig = (char *)0x0;
  local_168.output_arg = (char *)0x0;
  local_168.output_orig = (char *)0x0;
  local_168.shellRadius_arg = (double *)0x0;
  local_168.shellRadius_orig = (char **)0x0;
  local_168.molFraction_arg = (double *)0x0;
  local_168.molFraction_orig = (char **)0x0;
  local_168.help_help = gengetopt_args_info_help[0];
  local_168.version_help = gengetopt_args_info_help[1];
  local_168.output_help = gengetopt_args_info_help[2];
  local_168.latticeConstant_help = gengetopt_args_info_help[3];
  local_168.radius_help = gengetopt_args_info_help[4];
  local_168.length_help = gengetopt_args_info_help[5];
  local_168.shellRadius_help = gengetopt_args_info_help[6];
  local_168.shellRadius_min = 0;
  local_168.shellRadius_max = 0;
  local_168.molFraction_help = gengetopt_args_info_help[7];
  local_168.molFraction_min = 0;
  local_168.molFraction_max = 0;
  local_168.vacancyPercent_help = gengetopt_args_info_help[8];
  local_168.vacancyInnerRadius_help = gengetopt_args_info_help[9];
  local_168.vacancyOuterRadius_help = gengetopt_args_info_help[10];
  local_168.inputs = (char **)0x0;
  local_168.inputs_num = 0;
  local_238 = &args_info->vacancyOuterRadius_given;
  local_230 = &local_168.vacancyOuterRadius_given;
  local_218 = &args_info->vacancyInnerRadius_given;
  local_210 = &local_168.vacancyInnerRadius_given;
  local_1f8 = &args_info->vacancyPercent_given;
  local_1f0 = &local_168.vacancyPercent_given;
  local_1d8 = &args_info->length_given;
  local_1d0 = &local_168.length_given;
  local_1b8 = &args_info->radius_given;
  local_1b0 = &local_168.radius_given;
  local_198 = &args_info->latticeConstant_given;
  local_190 = &local_168.latticeConstant_given;
  local_178 = &args_info->output_given;
  local_170 = &local_168.output_given;
  iVar10 = params->print_errors;
  local_240 = &args_info->vacancyOuterRadius_arg;
  local_248 = (custom_getopt_data *)&args_info->vacancyOuterRadius_orig;
  local_220 = &args_info->vacancyInnerRadius_arg;
  local_228 = (custom_getopt_data *)&args_info->vacancyInnerRadius_orig;
  local_200 = &args_info->vacancyPercent_arg;
  local_208 = (custom_getopt_data *)&args_info->vacancyPercent_orig;
  local_1e0 = &args_info->length_arg;
  local_1e8 = (custom_getopt_data *)&args_info->length_orig;
  local_1c0 = &args_info->radius_arg;
  local_1c8 = (custom_getopt_data *)&args_info->radius_orig;
  local_1a0 = &args_info->latticeConstant_arg;
  local_1a8 = (custom_getopt_data *)&args_info->latticeConstant_orig;
  local_180 = &args_info->output_arg;
  local_188 = (custom_getopt_data *)&args_info->output_orig;
  pcVar15 = (custom_getopt_data *)0x0;
  iVar21 = 0;
  local_260 = args_info;
  local_258 = uVar23;
  do {
    local_29c = 0;
    iVar9 = (int)uVar23;
    custom_opterr = iVar10;
    _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar21;
    if (iVar9 < 1) {
      pcVar17 = (char *)0xffffffff;
    }
    else {
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = (custom_getopt_data *)0x0;
      if ((iVar21 == 0) || ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_4 & 1) == 0)) {
        if (iVar21 == 0) {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = 1;
        }
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (custom_getopt_data *)0x0;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_4 = 1;
      }
      custom_optarg = (char *)pcVar15;
      if ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 == (custom_getopt_data *)0x0) ||
         (*(char *)&_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5->custom_optind == '\0')) {
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 <
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 =
               _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        }
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 <
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6) {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
               _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        }
        pcVar16 = (char *)CONCAT71((int7)((ulong)pcVar16 >> 8),
                                   _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 ==
                                   _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 ||
                                   _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 ==
                                   _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7);
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 ==
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 ||
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 ==
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) {
          if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 !=
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
                 _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          }
        }
        else {
          in_stack_fffffffffffffd30 = 0x12e9bc;
          exchange(argv,(custom_getopt_data *)pcVar16);
        }
        iVar21 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 < iVar9) {
          ppcVar14 = argv + _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          do {
            if ((**ppcVar14 == '-') &&
               (iVar21 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0,
               (*ppcVar14)[1] != '\0')) break;
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
                 _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
            ppcVar14 = ppcVar14 + 1;
            iVar21 = iVar9;
          } while (iVar9 != _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0);
        }
        iVar8 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        iVar5 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
        iVar6 = iVar21;
        if (iVar21 != iVar9) {
          pcVar16 = "--";
          in_stack_fffffffffffffd30 = 0x12ea0e;
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 = iVar21;
          iVar7 = strcmp(argv[iVar21],"--");
          iVar8 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          iVar5 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
          iVar6 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7;
          if ((iVar7 == 0) &&
             (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar21 + 1, iVar8 = iVar9,
             iVar5 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0, iVar6 = iVar9,
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 != iVar21)) {
            in_stack_fffffffffffffd30 = 0x12ea33;
            exchange(argv,(custom_getopt_data *)pcVar16);
            iVar5 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
          }
        }
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 = iVar6;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 = iVar5;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar8;
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 == iVar9) {
          pcVar17 = (char *)0xffffffff;
          if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 !=
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) {
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
                 _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
          }
LAB_0012eaaa:
          bVar26 = false;
        }
        else {
          pcVar15 = (custom_getopt_data *)argv[_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0]
          ;
          if ((*(char *)&pcVar15->custom_optind != '-') ||
             (cVar24 = *(char *)((long)&pcVar15->custom_optind + 1), cVar24 == '\0')) {
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
                 _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
            pcVar17 = (char *)0x1;
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar15;
            goto LAB_0012eaaa;
          }
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 =
               (custom_getopt_data *)((long)&pcVar15->custom_optind + (ulong)(cVar24 == '-') + 1);
          pcVar17 = (char *)0x0;
          bVar26 = true;
        }
        local_29c = 0;
        if (!bVar26) goto LAB_0012ee71;
      }
      pcVar15 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
      iVar21 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      pcVar17 = argv[_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0];
      if (pcVar17[1] == '-') {
        for (sVar18 = 0;
            (cVar24 = *(char *)((long)&_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5->
                                       custom_optind + sVar18), cVar24 != '\0' && (cVar24 != '='));
            sVar18 = sVar18 + 1) {
        }
        local_29c = -1;
        iVar21 = 0;
        bVar26 = true;
        pcVar25 = "help";
        bVar4 = false;
        poVar20 = cmdline_parser_internal::long_options;
        poVar27 = (option *)0x0;
        local_250 = (long)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        do {
          in_stack_fffffffffffffd30 = 0x12eb97;
          pcVar16 = (char *)pcVar15;
          iVar8 = strncmp(pcVar25,(char *)pcVar15,sVar18);
          poVar28 = poVar27;
          iVar9 = local_29c;
          if (iVar8 == 0) {
            in_stack_fffffffffffffd30 = 0x12eba3;
            sVar12 = strlen(pcVar25);
            poVar28 = poVar20;
            iVar9 = iVar21;
            if ((int)sVar12 == (int)sVar18) break;
            if ((poVar27 != (option *)0x0) &&
               (((poVar28 = poVar27, poVar27->has_arg != poVar20->has_arg ||
                 (poVar27->flag != poVar20->flag)) ||
                (iVar9 = local_29c, poVar27->val != poVar20->val)))) {
              bVar4 = true;
              iVar9 = local_29c;
            }
          }
          local_29c = iVar9;
          iVar21 = iVar21 + 1;
          pcVar25 = poVar20[1].name;
          poVar20 = poVar20 + 1;
          bVar26 = pcVar25 != (char *)0x0;
          poVar27 = poVar28;
          iVar9 = local_29c;
        } while (bVar26);
        local_29c = iVar9;
        uVar23 = local_258;
        in_stack_fffffffffffffd48 = poVar28;
        if ((bool)(!bVar4 | bVar26)) {
          if (poVar28 == (option *)0x0) {
            if (iVar10 != 0) {
              pcVar16 = "%s: unrecognized option `--%s\'\n";
              in_stack_fffffffffffffd30 = 0x12f293;
              fprintf(_stderr,"%s: unrecognized option `--%s\'\n",*argv,pcVar15);
            }
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
                 _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (custom_getopt_data *)0x2a333b;
            in_stack_fffffffffffffd48 = poVar28;
LAB_0012ee6e:
            pcVar17 = (char *)0x3f;
            local_29c = 0;
          }
          else {
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = (int)local_250 + 1;
            if (*(char *)((long)&pcVar15->custom_optind + sVar18) == '\0') {
              if (poVar28->has_arg == 1) {
                if ((int)local_258 <= _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
                  if (iVar10 != 0) {
                    pcVar25 = *argv;
                    pcVar16 = "%s: option `%s\' requires an argument\n";
                    goto LAB_0012f2ca;
                  }
                  goto LAB_0012ee4a;
                }
                _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = (int)local_250 + 2;
                _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 =
                     (custom_getopt_data *)argv[local_250 + 1];
              }
            }
            else {
              if (poVar28->has_arg == 0) {
                if (iVar10 != 0) {
                  pcVar25 = *argv;
                  if (pcVar17[1] == '-') {
                    pcVar17 = poVar28->name;
                    pcVar16 = "%s: option `--%s\' doesn\'t allow an argument\n";
LAB_0012f2ca:
                    fprintf(_stderr,pcVar16,pcVar25,pcVar17);
                  }
                  else {
                    pcVar16 = "%s: option `%c%s\' doesn\'t allow an argument\n";
                    fprintf(_stderr,"%s: option `%c%s\' doesn\'t allow an argument\n",pcVar25,
                            (ulong)(uint)(int)*pcVar17,poVar28->name);
                  }
                }
LAB_0012ee4a:
                pcVar15 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
                in_stack_fffffffffffffd30 = 0x12ee59;
                sVar18 = strlen((char *)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5);
                _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 =
                     (custom_getopt_data *)((long)&pcVar15->custom_optind + sVar18);
                in_stack_fffffffffffffd48 = poVar28;
                goto LAB_0012ee6e;
              }
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 =
                   (custom_getopt_data *)((long)&pcVar15->custom_optind + sVar18 + 1);
            }
            in_stack_fffffffffffffd30 = 0x12ed51;
            sVar18 = strlen((char *)pcVar15);
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 =
                 (custom_getopt_data *)((long)&pcVar15->custom_optind + sVar18);
            pcVar17 = (char *)(ulong)(uint)poVar28->val;
            if ((uint *)poVar28->flag != (uint *)0x0) {
              *poVar28->flag = poVar28->val;
              pcVar17 = (char *)0x0;
            }
          }
        }
        else {
          if (iVar10 != 0) {
            pcVar16 = "%s: option `%s\' is ambiguous\n";
            fprintf(_stderr,"%s: option `%s\' is ambiguous\n",*argv,pcVar17);
            in_stack_fffffffffffffd48 = poVar28;
          }
          pcVar15 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
          in_stack_fffffffffffffd30 = 0x12ecb0;
          sVar18 = strlen((char *)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5);
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
               _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 =
               (custom_getopt_data *)((long)&pcVar15->custom_optind + sVar18);
          pcVar17 = (char *)0x3f;
LAB_0012ed14:
          local_29c = 0;
        }
      }
      else {
        pcVar1 = (custom_getopt_data *)
                 ((long)&_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5->custom_optind + 1);
        cVar24 = *(char *)&_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5->custom_optind;
        pcVar19 = (custom_getopt_data *)(ulong)(uint)(int)cVar24;
        in_stack_fffffffffffffd30 = 0x12eb1a;
        pcVar16 = (char *)pcVar19;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar1;
        pvVar11 = memchr("hVo:",(int)cVar24,5);
        if (*(char *)((long)&pcVar15->custom_optind + 1) == '\0') {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar21 + 1;
        }
        if (cVar24 != ':' && pvVar11 != (void *)0x0) {
          if (*(char *)((long)pvVar11 + 1) == ':') {
            if (*(char *)((long)pvVar11 + 2) == ':') {
              if (*(char *)&pcVar1->custom_optind == '\0') {
                _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = (custom_getopt_data *)0x0;
              }
              else {
LAB_0012ecf5:
                _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
                     _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
                _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar1;
              }
            }
            else {
              if (*(char *)&pcVar1->custom_optind != '\0') goto LAB_0012ecf5;
              lVar13 = (long)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
              if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 == iVar9) {
                cVar24 = '?';
                if (iVar10 != 0) {
                  pcVar16 = "%s: option requires an argument -- %c\n";
                  in_stack_fffffffffffffd30 = 0x12edeb;
                  fprintf(_stderr,"%s: option requires an argument -- %c\n",*argv,pcVar19);
                }
              }
              else {
                _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
                     _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
                _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 =
                     (custom_getopt_data *)argv[lVar13];
              }
            }
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (custom_getopt_data *)0x0;
          }
          pcVar17 = (char *)(ulong)(uint)(int)cVar24;
          goto LAB_0012ed14;
        }
        pcVar17 = (char *)0x3f;
        if (iVar10 == 0) goto LAB_0012ee6e;
        pcVar16 = "%s: invalid option -- %c\n";
        local_29c = 0;
        in_stack_fffffffffffffd30 = 0x12ee16;
        fprintf(_stderr,"%s: invalid option -- %c\n",*argv,pcVar19);
      }
    }
LAB_0012ee71:
    pcVar15 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
    iVar21 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
    iVar10 = custom_opterr;
    custom_optarg = (char *)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
    iVar9 = (int)pcVar17;
    if (iVar9 < 0x3f) {
      iVar8 = 3;
      if (iVar9 == -1) goto LAB_0012f08b;
      in_stack_fffffffffffffd48 =
           (option *)
           CONCAT44((int)((ulong)in_stack_fffffffffffffd48 >> 0x20),
                    _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0);
      if (iVar9 != 0) goto LAB_0012f468;
      pcVar17 = cmdline_parser_internal::long_options[local_29c].name;
      in_stack_fffffffffffffd30 = 0x12eef7;
      iVar21 = strcmp(pcVar17,"latticeConstant");
      if (iVar21 == 0) {
        in_R9 = 2;
        pcVar16 = (char *)local_1a8;
        iVar21 = update_arg(local_1a0,(char **)local_1a8,local_198,local_190,(char *)pcVar15,
                            (char **)0x2,default_value,arg_type,0,0,0x296dbb,0x2d,additional_error,
                            (char)in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd38);
LAB_0012f142:
        bVar26 = iVar21 == 0;
      }
      else {
        in_stack_fffffffffffffd30 = 0x12ef15;
        iVar21 = strcmp(pcVar17,"radius");
        if (iVar21 == 0) {
          in_R9 = 2;
          pcVar16 = (char *)local_1c8;
          iVar21 = update_arg(local_1c0,(char **)local_1c8,local_1b8,local_1b0,(char *)pcVar15,
                              (char **)0x2,default_value,arg_type,0,0,0x2a0ed2,0x2d,additional_error
                              ,(char)in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd38);
          goto LAB_0012f142;
        }
        in_stack_fffffffffffffd30 = 0x12ef2f;
        iVar21 = strcmp(pcVar17,"length");
        if (iVar21 == 0) {
          in_R9 = 2;
          pcVar16 = (char *)local_1e8;
          iVar21 = update_arg(local_1e0,(char **)local_1e8,local_1d8,local_1d0,(char *)pcVar15,
                              (char **)0x2,default_value,arg_type,0,0,0x29e027,0x2d,additional_error
                              ,(char)in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd38);
          goto LAB_0012f142;
        }
        pcVar25 = "shellRadius";
        iVar21 = strcmp(pcVar17,"shellRadius");
        if (iVar21 == 0) {
          list = &shellRadius_list;
          pcVar16 = (char *)&local_168.shellRadius_given;
LAB_0012f1bc:
          in_stack_fffffffffffffd30 = 0x12f1cc;
          iVar21 = update_multiple_arg_temp
                             (list,(uint *)pcVar16,(char *)pcVar15,(char **)pcVar25,additional_error
                              ,(cmdline_parser_arg_type)in_R9,(char *)in_stack_fffffffffffffd38,
                              in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd48);
LAB_0012f23d:
          bVar26 = iVar21 == 0;
        }
        else {
          pcVar25 = "molFraction";
          iVar21 = strcmp(pcVar17,"molFraction");
          if (iVar21 == 0) {
            list = &molFraction_list;
            pcVar16 = (char *)&local_168.molFraction_given;
            goto LAB_0012f1bc;
          }
          iVar9 = 0x296de3;
          in_stack_fffffffffffffd30 = 0x12ef83;
          iVar21 = strcmp(pcVar17,"vacancyPercent");
          prev_given = local_1f0;
          field_given = local_1f8;
          pcVar16 = (char *)local_208;
          field = local_200;
          if (iVar21 == 0) {
LAB_0012f218:
            in_R9 = 2;
            iVar21 = update_arg(field,(char **)pcVar16,field_given,prev_given,(char *)pcVar15,
                                (char **)0x2,default_value,arg_type,0,0,iVar9,0x2d,additional_error,
                                (char)in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd38);
            goto LAB_0012f23d;
          }
          iVar9 = 0x296df2;
          in_stack_fffffffffffffd30 = 0x12ef9d;
          iVar21 = strcmp(pcVar17,"vacancyInnerRadius");
          prev_given = local_210;
          field_given = local_218;
          pcVar16 = (char *)local_228;
          field = local_220;
          if (iVar21 == 0) goto LAB_0012f218;
          pcVar16 = "vacancyOuterRadius";
          in_stack_fffffffffffffd30 = 0x12efb4;
          iVar9 = strcmp(pcVar17,"vacancyOuterRadius");
          iVar21 = (int)in_stack_fffffffffffffd48;
          if (iVar9 != 0) goto LAB_0012f089;
          in_R9 = 2;
          pcVar16 = (char *)local_248;
          iVar21 = update_arg(local_240,(char **)local_248,local_238,local_230,(char *)pcVar15,
                              (char **)0x2,default_value,arg_type,0,0,0x296e05,0x2d,additional_error
                              ,(char)in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd38);
          bVar26 = iVar21 == 0;
        }
      }
      iVar8 = 5;
      iVar21 = (int)in_stack_fffffffffffffd48;
      if (bVar26) goto LAB_0012f089;
    }
    else if (iVar9 < 0x68) {
      if (iVar9 != 0x3f) {
        if (iVar9 != 0x56) {
LAB_0012f468:
          cmdline_parser_internal();
          iVar10 = cmdline_parser_required2
                             ((gengetopt_args_info *)additional_error,pcVar17,(char *)0x0);
          return iVar10;
        }
        cmdline_parser_print_version();
LAB_0012f454:
        cmdline_parser_free(&local_168);
        exit(0);
      }
      iVar8 = 5;
    }
    else {
      if (iVar9 != 0x6f) {
        if (iVar9 != 0x68) goto LAB_0012f468;
        cmdline_parser_print_help();
        goto LAB_0012f454;
      }
      in_R9 = 1;
      pcVar16 = (char *)local_188;
      iVar9 = update_arg(local_180,(char **)local_188,local_178,local_170,
                         (char *)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3,(char **)0x1,
                         default_value,arg_type,0,0,0x296db4,0x6f,additional_error,
                         (char)in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd38);
      iVar8 = 5;
      if (iVar9 != 0) goto LAB_0012f08b;
LAB_0012f089:
      iVar8 = 0;
    }
LAB_0012f08b:
    args_info_00 = local_260;
    arg_type_00 = (cmdline_parser_arg_type)in_R9;
    if (iVar8 != 0) {
      if (iVar8 == 5) {
        free_list(shellRadius_list,(short)pcVar16);
        free_list(molFraction_list,(short)pcVar16);
        cmdline_parser_release(&local_168);
        iVar10 = 1;
      }
      else {
        update_multiple_arg(&local_260->shellRadius_arg,&local_260->shellRadius_orig,
                            local_260->shellRadius_given,local_168.shellRadius_given,
                            &shellRadius_list->arg,arg_type_00,in_stack_fffffffffffffd38);
        update_multiple_arg(&args_info_00->molFraction_arg,&args_info_00->molFraction_orig,
                            args_info_00->molFraction_given,local_168.molFraction_given,
                            &molFraction_list->arg,arg_type_00,in_stack_fffffffffffffd38);
        uVar22 = local_168.shellRadius_given;
        local_168.shellRadius_given = 0;
        uVar2 = args_info_00->shellRadius_given;
        uVar3 = args_info_00->molFraction_given;
        args_info_00->shellRadius_given = uVar2 + uVar22;
        args_info_00->molFraction_given = uVar3 + local_168.molFraction_given;
        local_168.molFraction_given = 0;
        if (local_264 == 0) {
          cmdline_parser_release(&local_168);
        }
        else {
          iVar10 = cmdline_parser_required2(args_info_00,*argv,additional_error);
          cmdline_parser_release(&local_168);
          args_info_00 = local_260;
          if (iVar10 != 0) {
            return 1;
          }
        }
        iVar10 = 0;
        uVar22 = (int)uVar23 - iVar21;
        if (uVar22 != 0 && iVar21 <= (int)uVar23) {
          args_info_00->inputs_num = uVar22;
          ppcVar14 = (char **)malloc((ulong)uVar22 * 8);
          args_info_00->inputs = ppcVar14;
          iVar10 = 0;
          uVar23 = 0;
          do {
            pcVar16 = gengetopt_strdup(argv[(long)iVar21 + uVar23]);
            args_info_00->inputs[uVar23] = pcVar16;
            uVar23 = uVar23 + 1;
          } while (uVar22 != uVar23);
        }
      }
      return iVar10;
    }
  } while( true );
}

Assistant:

int
cmdline_parser_internal (
  int argc, char **argv, struct gengetopt_args_info *args_info,
                        struct cmdline_parser_params *params, const char *additional_error)
{
  int c;	/* Character of the parsed option.  */

  struct generic_list * shellRadius_list = NULL;
  struct generic_list * molFraction_list = NULL;
  int error_occurred = 0;
  struct gengetopt_args_info local_args_info;
  
  int override;
  int initialize;
  int check_required;
  int check_ambiguity;

  char *optarg;
  int optind;
  int opterr;
  int optopt;
  
  package_name = argv[0];
  
  override = params->override;
  initialize = params->initialize;
  check_required = params->check_required;
  check_ambiguity = params->check_ambiguity;

  if (initialize)
    cmdline_parser_init (args_info);

  cmdline_parser_init (&local_args_info);

  optarg = 0;
  optind = 0;
  opterr = params->print_errors;
  optopt = '?';

  while (1)
    {
      int option_index = 0;

      static struct option long_options[] = {
        { "help",	0, NULL, 'h' },
        { "version",	0, NULL, 'V' },
        { "output",	1, NULL, 'o' },
        { "latticeConstant",	1, NULL, 0 },
        { "radius",	1, NULL, 0 },
        { "length",	1, NULL, 0 },
        { "shellRadius",	1, NULL, 0 },
        { "molFraction",	1, NULL, 0 },
        { "vacancyPercent",	1, NULL, 0 },
        { "vacancyInnerRadius",	1, NULL, 0 },
        { "vacancyOuterRadius",	1, NULL, 0 },
        { 0,  0, 0, 0 }
      };

      custom_optarg = optarg;
      custom_optind = optind;
      custom_opterr = opterr;
      custom_optopt = optopt;

      c = custom_getopt_long (argc, argv, "hVo:", long_options, &option_index);

      optarg = custom_optarg;
      optind = custom_optind;
      opterr = custom_opterr;
      optopt = custom_optopt;

      if (c == -1) break;	/* Exit from `while (1)' loop.  */

      switch (c)
        {
        case 'h':	/* Print help and exit.  */
          cmdline_parser_print_help ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'V':	/* Print version and exit.  */
          cmdline_parser_print_version ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'o':	/* Output file name.  */
        
        
          if (update_arg( (void *)&(args_info->output_arg), 
               &(args_info->output_orig), &(args_info->output_given),
              &(local_args_info.output_given), optarg, 0, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "output", 'o',
              additional_error))
            goto failure;
        
          break;

        case 0:	/* Long option with no short option */
          /* Lattice spacing in Angstroms for cubic lattice..  */
          if (strcmp (long_options[option_index].name, "latticeConstant") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->latticeConstant_arg), 
                 &(args_info->latticeConstant_orig), &(args_info->latticeConstant_given),
                &(local_args_info.latticeConstant_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "latticeConstant", '-',
                additional_error))
              goto failure;
          
          }
          /* Nanorod radius in Angstroms.  */
          else if (strcmp (long_options[option_index].name, "radius") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->radius_arg), 
                 &(args_info->radius_orig), &(args_info->radius_given),
                &(local_args_info.radius_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "radius", '-',
                additional_error))
              goto failure;
          
          }
          /* Nanorod length in Angstroms.  */
          else if (strcmp (long_options[option_index].name, "length") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->length_arg), 
                 &(args_info->length_orig), &(args_info->length_given),
                &(local_args_info.length_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "length", '-',
                additional_error))
              goto failure;
          
          }
          /* Radius containing within it only molecules of a specific component. Specified for each component > 1 in the template file..  */
          else if (strcmp (long_options[option_index].name, "shellRadius") == 0)
          {
          
            if (update_multiple_arg_temp(&shellRadius_list, 
                &(local_args_info.shellRadius_given), optarg, 0, 0, ARG_DOUBLE,
                "shellRadius", '-',
                additional_error))
              goto failure;
          
          }
          /* Builds a multi-component random alloy nanoparticle. A mole Fraction must be specified for each component > 1 in the template file..  */
          else if (strcmp (long_options[option_index].name, "molFraction") == 0)
          {
          
            if (update_multiple_arg_temp(&molFraction_list, 
                &(local_args_info.molFraction_given), optarg, 0, 0, ARG_DOUBLE,
                "molFraction", '-',
                additional_error))
              goto failure;
          
          }
          /* Percentage of atoms to remove from within vacancy range.  */
          else if (strcmp (long_options[option_index].name, "vacancyPercent") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->vacancyPercent_arg), 
                 &(args_info->vacancyPercent_orig), &(args_info->vacancyPercent_given),
                &(local_args_info.vacancyPercent_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "vacancyPercent", '-',
                additional_error))
              goto failure;
          
          }
          /* Radius arround core-shell where vacancies should be located..  */
          else if (strcmp (long_options[option_index].name, "vacancyInnerRadius") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->vacancyInnerRadius_arg), 
                 &(args_info->vacancyInnerRadius_orig), &(args_info->vacancyInnerRadius_given),
                &(local_args_info.vacancyInnerRadius_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "vacancyInnerRadius", '-',
                additional_error))
              goto failure;
          
          }
          /* Radius arround core-shell where vacancies should be located..  */
          else if (strcmp (long_options[option_index].name, "vacancyOuterRadius") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->vacancyOuterRadius_arg), 
                 &(args_info->vacancyOuterRadius_orig), &(args_info->vacancyOuterRadius_given),
                &(local_args_info.vacancyOuterRadius_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "vacancyOuterRadius", '-',
                additional_error))
              goto failure;
          
          }
          
          break;
        case '?':	/* Invalid option.  */
          /* `getopt_long' already printed an error message.  */
          goto failure;

        default:	/* bug: option not considered.  */
          fprintf (stderr, "%s: option unknown: %c%s\n", CMDLINE_PARSER_PACKAGE, c, (additional_error ? additional_error : ""));
          abort ();
        } /* switch */
    } /* while */


  update_multiple_arg((void *)&(args_info->shellRadius_arg),
    &(args_info->shellRadius_orig), args_info->shellRadius_given,
    local_args_info.shellRadius_given, 0,
    ARG_DOUBLE, shellRadius_list);
  update_multiple_arg((void *)&(args_info->molFraction_arg),
    &(args_info->molFraction_orig), args_info->molFraction_given,
    local_args_info.molFraction_given, 0,
    ARG_DOUBLE, molFraction_list);

  args_info->shellRadius_given += local_args_info.shellRadius_given;
  local_args_info.shellRadius_given = 0;
  args_info->molFraction_given += local_args_info.molFraction_given;
  local_args_info.molFraction_given = 0;
  
  if (check_required)
    {
      error_occurred += cmdline_parser_required2 (args_info, argv[0], additional_error);
    }

  cmdline_parser_release (&local_args_info);

  if ( error_occurred )
    return (EXIT_FAILURE);

  if (optind < argc)
    {
      int i = 0 ;
      int found_prog_name = 0;
      /* whether program name, i.e., argv[0], is in the remaining args
         (this may happen with some implementations of getopt,
          but surely not with the one included by gengetopt) */


      args_info->inputs_num = argc - optind - found_prog_name;
      args_info->inputs =
        (char **)(malloc ((args_info->inputs_num)*sizeof(char *))) ;
      while (optind < argc)
        args_info->inputs[ i++ ] = gengetopt_strdup (argv[optind++]) ;
    }

  return 0;

failure:
  free_list (shellRadius_list, 0 );
  free_list (molFraction_list, 0 );
  
  cmdline_parser_release (&local_args_info);
  return (EXIT_FAILURE);
}